

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::GlobalModuleField::~GlobalModuleField(GlobalModuleField *this)

{
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__GlobalModuleField_001f3b68;
  Global::~Global(&this->global);
  return;
}

Assistant:

explicit GlobalModuleField(const Location& loc = Location(),
                             string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Global>(loc), global(name) {}